

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

ProcessorInstanceRef * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::getOrCreateImplicitProcessorInstance
          (QualifiedIdentifierResolver *this,Context *c,ProcessorBase *processor,
          pool_ptr<soul::AST::Expression> *arguments)

{
  Allocator *this_00;
  bool bVar1;
  Graph *pGVar2;
  reference ppVar3;
  Expression *pEVar4;
  ProcessorInstance *pPVar5;
  string *__rhs;
  UnqualifiedName *pUVar6;
  ProcessorRef *o;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *pAVar7;
  Identifier *args;
  __type_conflict1 local_261;
  pool_ptr<soul::AST::Expression> local_228;
  Identifier local_220;
  pool_ptr<soul::AST::UnqualifiedName> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string name;
  ProcessorInstance *i;
  CompileMessage local_1b8;
  pool_ptr<soul::AST::Connection::SharedEndpoint> local_180;
  CompileMessage local_178;
  byte local_13b;
  byte local_13a;
  byte local_139;
  pool_ptr<soul::AST::Expression> local_138;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_130;
  string local_f8;
  pool_ptr<soul::AST::ProcessorBase> local_d8;
  pool_ref<soul::AST::ProcessorInstance> local_d0;
  pool_ref<soul::AST::ProcessorInstance> i_1;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range2;
  pool_ptr<soul::AST::Graph> local_a8;
  pool_ptr<soul::AST::Graph> currentGraph;
  pool_ptr<soul::AST::Expression> local_90;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_88;
  undefined1 local_50 [8];
  string signature;
  pool_ptr<soul::AST::Expression> *arguments_local;
  ProcessorBase *processor_local;
  Context *c_local;
  QualifiedIdentifierResolver *this_local;
  
  local_90 = (pool_ptr<soul::AST::Expression>)arguments->object;
  pAVar7 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)arguments;
  signature.field_2._8_8_ = arguments;
  AST::CommaSeparatedList::getAsExpressionList(&local_88,&local_90);
  ASTUtilities::
  getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
            ((string *)local_50,(ASTUtilities *)&(processor->super_ModuleBase).specialisationParams,
             (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
              *)&local_88,pAVar7);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
            (&local_88);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_90);
  __range2 = (vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
              *)(this->currentModule).object;
  cast<soul::AST::Graph,soul::AST::ModuleBase>
            ((soul *)&local_a8,(pool_ptr<soul::AST::ModuleBase> *)&__range2);
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&__range2);
  bVar1 = pool_ptr<soul::AST::Graph>::operator!=(&local_a8,(void *)0x0);
  pAVar7 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)0x409;
  checkAssertion(bVar1,"currentGraph != nullptr","getOrCreateImplicitProcessorInstance",0x409);
  pGVar2 = pool_ptr<soul::AST::Graph>::operator->(&local_a8);
  __end2 = std::
           vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ::begin(&pGVar2->processorInstances);
  i_1.object = (ProcessorInstance *)
               std::
               vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
               ::end(&pGVar2->processorInstances);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                                     *)&i_1), bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
             ::operator*(&__end2);
    local_d0.object = ppVar3->object;
    pPVar5 = pool_ref<soul::AST::ProcessorInstance>::operator->(&local_d0);
    local_139 = 0;
    local_13a = 0;
    local_13b = 0;
    pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&pPVar5->targetProcessor);
    (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_d8);
    bVar1 = pool_ptr<soul::AST::ProcessorBase>::operator==(&local_d8,processor);
    pAVar7 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
             CONCAT71((int7)((ulong)pAVar7 >> 8),bVar1);
    local_261 = false;
    if (bVar1) {
      pPVar5 = pool_ref<soul::AST::ProcessorInstance>::operator->(&local_d0);
      local_138.object = (pPVar5->specialisationArgs).object;
      local_139 = 1;
      AST::CommaSeparatedList::getAsExpressionList(&local_130,&local_138);
      local_13a = 1;
      ASTUtilities::
      getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
                (&local_f8,(ASTUtilities *)&(processor->super_ModuleBase).specialisationParams,
                 (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                  *)&local_130,pAVar7);
      local_13b = 1;
      local_261 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50,&local_f8);
    }
    if ((local_13b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_f8);
    }
    if ((local_13a & 1) != 0) {
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
                (&local_130);
    }
    if ((local_139 & 1) != 0) {
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_138);
    }
    pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_d8);
    if (local_261 == false) {
      bVar1 = false;
    }
    else {
      pPVar5 = pool_ref<soul::AST::ProcessorInstance>::operator->(&local_d0);
      bVar1 = pool_ptr<soul::AST::Connection::SharedEndpoint>::operator==
                        (&pPVar5->implicitInstanceSource,(void *)0x0);
      if (bVar1) {
        Errors::cannotUseProcessorInLet<soul::Identifier&>
                  (&local_178,(Errors *)&(processor->super_ModuleBase).name,args);
        AST::Context::throwError(c,&local_178,false);
      }
      pPVar5 = pool_ref<soul::AST::ProcessorInstance>::operator->(&local_d0);
      local_180.object = (this->currentConnectionEndpoint).object;
      bVar1 = pool_ptr<soul::AST::Connection::SharedEndpoint>::operator!=
                        (&pPVar5->implicitInstanceSource,&local_180);
      pool_ptr<soul::AST::Connection::SharedEndpoint>::~pool_ptr(&local_180);
      if (bVar1) {
        Errors::cannotReuseImplicitProcessorInstance<>();
        AST::Context::throwError(c,&local_1b8,false);
      }
      this_local = (QualifiedIdentifierResolver *)
                   AST::Allocator::
                   allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorInstance>&>
                             ((this->super_ModuleInstanceResolver).
                              super_ErrorIgnoringRewritingASTVisitor.allocator,c,&local_d0);
      bVar1 = true;
    }
    pool_ref<soul::AST::ProcessorInstance>::~pool_ref(&local_d0);
    if (bVar1) goto LAB_003a9dc6;
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
    ::operator++(&__end2);
  }
  pPVar5 = AST::Allocator::allocate<soul::AST::ProcessorInstance,soul::AST::Context&>
                     ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                      allocator,c);
  bVar1 = pool_ptr<soul::AST::Expression>::operator==(arguments,(void *)0x0);
  if (bVar1) {
    pUVar6 = AST::Allocator::
             allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                       ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                        allocator,c,&(processor->super_ModuleBase).name);
    pool_ptr<soul::AST::UnqualifiedName>::pool_ptr<soul::AST::UnqualifiedName,void>
              ((pool_ptr<soul::AST::UnqualifiedName> *)((long)&name.field_2 + 8),pUVar6);
    (pPVar5->instanceName).object = (UnqualifiedName *)name.field_2._8_8_;
    pool_ptr<soul::AST::UnqualifiedName>::~pool_ptr
              ((pool_ptr<soul::AST::UnqualifiedName> *)((long)&name.field_2 + 8));
  }
  else {
    pGVar2 = pool_ptr<soul::AST::Graph>::operator->(&local_a8);
    __rhs = Identifier::toString_abi_cxx11_(&(processor->super_ModuleBase).name);
    std::operator+(&local_210,"_instance_",__rhs);
    AST::Scope::makeUniqueName
              ((string *)local_1f0,&(pGVar2->super_ProcessorBase).super_ModuleBase.super_Scope,
               &local_210);
    std::__cxx11::string::~string((string *)&local_210);
    this_00 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator;
    local_220 = AST::Allocator::get<std::__cxx11::string>
                          (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1f0);
    pUVar6 = AST::Allocator::
             allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
                       (this_00,c,&local_220);
    pool_ptr<soul::AST::UnqualifiedName>::pool_ptr<soul::AST::UnqualifiedName,void>
              (&local_218,pUVar6);
    (pPVar5->instanceName).object = local_218.object;
    pool_ptr<soul::AST::UnqualifiedName>::~pool_ptr(&local_218);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  o = AST::Allocator::
      allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 allocator,c,processor);
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::ProcessorRef,void>(&local_228,o);
  (pPVar5->targetProcessor).object = local_228.object;
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_228);
  (pPVar5->specialisationArgs).object = arguments->object;
  (pPVar5->implicitInstanceSource).object = (this->currentConnectionEndpoint).object;
  pGVar2 = pool_ptr<soul::AST::Graph>::operator->(&local_a8);
  AST::Graph::addProcessorInstance(pGVar2,pPVar5);
  this_local = (QualifiedIdentifierResolver *)
               AST::Allocator::
               allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::AST::ProcessorInstance&>
                         ((this->super_ModuleInstanceResolver).
                          super_ErrorIgnoringRewritingASTVisitor.allocator,c,pPVar5);
LAB_003a9dc6:
  pool_ptr<soul::AST::Graph>::~pool_ptr(&local_a8);
  std::__cxx11::string::~string((string *)local_50);
  return (ProcessorInstanceRef *)this_local;
}

Assistant:

AST::ProcessorInstanceRef& getOrCreateImplicitProcessorInstance (AST::Context& c,
                                                                         AST::ProcessorBase& processor,
                                                                         pool_ptr<AST::Expression> arguments)
        {
            auto signature = ASTUtilities::getSpecialisationSignature (processor.specialisationParams,
                                                                       AST::CommaSeparatedList::getAsExpressionList (arguments));

            auto currentGraph = cast<AST::Graph> (currentModule);
            SOUL_ASSERT (currentGraph != nullptr);

            for (auto i : currentGraph->processorInstances)
            {
                if (i->targetProcessor->getAsProcessor() == processor
                     && signature == ASTUtilities::getSpecialisationSignature (processor.specialisationParams,
                                                                               AST::CommaSeparatedList::getAsExpressionList (i->specialisationArgs)))
                {
                    if (i->implicitInstanceSource == nullptr)
                        c.throwError (Errors::cannotUseProcessorInLet (processor.name));

                    if (i->implicitInstanceSource != currentConnectionEndpoint)
                        c.throwError (Errors::cannotReuseImplicitProcessorInstance());

                    return allocator.allocate<AST::ProcessorInstanceRef> (c, i);
                }
            }

            auto& i = allocator.allocate<AST::ProcessorInstance> (c);

            if (arguments == nullptr)
            {
                i.instanceName = allocator.allocate<AST::UnqualifiedName> (c, processor.name);
            }
            else
            {
                auto name = currentGraph->makeUniqueName ("_instance_" + processor.name.toString());
                i.instanceName = allocator.allocate<AST::UnqualifiedName> (c, allocator.get (name));
            }

            i.targetProcessor = allocator.allocate<AST::ProcessorRef> (c, processor);
            i.specialisationArgs = arguments;
            i.implicitInstanceSource = currentConnectionEndpoint;
            currentGraph->addProcessorInstance (i);
            return allocator.allocate<AST::ProcessorInstanceRef> (c, i);
        }